

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ByteData *
cfd::core::HDWallet::ConvertMnemonicToEntropy
          (ByteData *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *language)

{
  bool bVar1;
  CfdException *this;
  allocator local_41;
  undefined1 local_40 [32];
  
  bVar1 = CheckSupportedLanguages(language);
  if (bVar1) {
    WallyUtil::ConvertMnemonicToEntropy(__return_storage_ptr__,mnemonic,language,false);
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_hdwallet.cpp";
  local_40._8_4_ = 0x174;
  local_40._16_8_ = "ConvertMnemonicToEntropy";
  logger::warn<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_40,"Not support language passed. language=[{}]",language);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"Not support language passed.",&local_41);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData HDWallet::ConvertMnemonicToEntropy(
    const std::vector<std::string>& mnemonic, const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::ConvertMnemonicToEntropy(mnemonic, language);
}